

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O2

void stbir__encode_scanline
               (stbir__info *stbir_info,int num_pixels,void *output_buffer,float *encode_buffer,
               int channels,int alpha_channel,int decode)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  float *pfVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  stbir_uint16 nonalpha [64];
  ushort auStack_b8 [68];
  
  lVar10 = (long)channels;
  lVar9 = (long)alpha_channel;
  if ((stbir_info->flags & 1) == 0) {
    uVar2 = 0;
    uVar6 = (ulong)(uint)channels;
    if (channels < 1) {
      uVar6 = uVar2;
    }
    uVar3 = 0;
    pfVar7 = encode_buffer;
    if (0 < num_pixels) {
      uVar3 = (ulong)(uint)num_pixels;
    }
    for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
      fVar11 = encode_buffer[lVar9 + uVar2 * lVar10];
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        if ((uint)alpha_channel != uVar8) {
          pfVar7[uVar8] = pfVar7[uVar8] * (float)(-(uint)(fVar11 != 0.0) & (uint)(1.0 / fVar11));
        }
      }
      pfVar7 = pfVar7 + lVar10;
    }
  }
  else {
    uVar5 = 0;
    if (0 < channels) {
      uVar5 = channels;
    }
    uVar6 = (ulong)uVar5;
  }
  uVar5 = 0;
  for (iVar1 = 0; (int)uVar6 != iVar1; iVar1 = iVar1 + 1) {
    if ((alpha_channel != iVar1) || ((stbir_info->flags & 2) != 0)) {
      lVar4 = (long)(int)uVar5;
      uVar5 = uVar5 + 1;
      auStack_b8[lVar4] = (ushort)iVar1;
    }
  }
  switch(decode) {
  case 0:
    uVar3 = 0;
    uVar2 = (ulong)(uint)num_pixels;
    if (num_pixels < 1) {
      uVar2 = uVar3;
    }
    for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        fVar11 = encode_buffer[uVar8];
        fVar12 = 1.0;
        if (fVar11 <= 1.0) {
          fVar12 = fVar11;
        }
        *(char *)((long)output_buffer + uVar8) =
             (char)(int)((float)(~-(uint)(fVar11 < 0.0) & (uint)(fVar12 * 255.0)) + 0.5);
      }
      encode_buffer = encode_buffer + lVar10;
      output_buffer = (void *)((long)output_buffer + lVar10);
    }
    break;
  case 1:
    uVar2 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar2;
    }
    uVar3 = (ulong)(uint)num_pixels;
    if (num_pixels < 1) {
      uVar3 = uVar2;
    }
    for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        lVar4 = (ulong)auStack_b8[uVar8] + uVar2 * lVar10;
        fVar11 = encode_buffer[lVar4];
        if (fVar11 <= 0.00012207031) {
          fVar11 = 0.00012207031;
        }
        fVar12 = 0.99999994;
        if (fVar11 <= 0.99999994) {
          fVar12 = fVar11;
        }
        *(char *)((long)output_buffer + lVar4) =
             (char)(((uint)fVar12 >> 0xc & 0xff) *
                    (fp32_to_srgb8_tab4[(int)fVar12 + 0xc7000000U >> 0x14] & 0xffff) +
                    (fp32_to_srgb8_tab4[(int)fVar12 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00) >> 0x10)
        ;
      }
      if ((stbir_info->flags & 2) == 0) {
        lVar4 = uVar2 * lVar10 + lVar9;
        fVar11 = encode_buffer[lVar4];
        fVar12 = 1.0;
        if (fVar11 <= 1.0) {
          fVar12 = fVar11;
        }
        *(char *)((long)output_buffer + lVar4) =
             (char)(int)((float)(~-(uint)(fVar11 < 0.0) & (uint)(fVar12 * 255.0)) + 0.5);
      }
    }
    break;
  case 2:
    uVar3 = 0;
    uVar2 = (ulong)(uint)num_pixels;
    if (num_pixels < 1) {
      uVar2 = uVar3;
    }
    for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        fVar11 = encode_buffer[uVar8];
        fVar12 = 1.0;
        if (fVar11 <= 1.0) {
          fVar12 = fVar11;
        }
        *(short *)((long)output_buffer + uVar8 * 2) =
             (short)(int)((float)(~-(uint)(fVar11 < 0.0) & (uint)(fVar12 * 65535.0)) + 0.5);
      }
      encode_buffer = encode_buffer + lVar10;
      output_buffer = (void *)((long)output_buffer + lVar10 * 2);
    }
    break;
  case 3:
    uVar2 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar2;
    }
    uVar3 = (ulong)(uint)num_pixels;
    if (num_pixels < 1) {
      uVar3 = uVar2;
    }
    for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        lVar4 = (ulong)auStack_b8[uVar8] + uVar2 * lVar10;
        fVar11 = encode_buffer[lVar4];
        fVar12 = 1.0;
        if (fVar11 <= 1.0) {
          fVar12 = fVar11;
        }
        fVar12 = (float)(~-(uint)(fVar11 < 0.0) & (uint)fVar12);
        if (fVar12 <= 0.0031308) {
          fVar12 = fVar12 * 12.92;
        }
        else {
          dVar13 = pow((double)fVar12,0.4166666567325592);
          fVar12 = (float)dVar13 * 1.055 + -0.055;
        }
        *(short *)((long)output_buffer + lVar4 * 2) = (short)(int)(fVar12 * 65535.0 + 0.5);
      }
      if ((stbir_info->flags & 2) == 0) {
        lVar4 = uVar2 * lVar10 + lVar9;
        fVar11 = encode_buffer[lVar4];
        fVar12 = 1.0;
        if (fVar11 <= 1.0) {
          fVar12 = fVar11;
        }
        *(short *)((long)output_buffer + lVar4 * 2) =
             (short)(int)((float)(~-(uint)(fVar11 < 0.0) & (uint)(fVar12 * 65535.0)) + 0.5);
      }
    }
    break;
  case 4:
    uVar3 = 0;
    uVar2 = (ulong)(uint)num_pixels;
    if (num_pixels < 1) {
      uVar2 = uVar3;
    }
    for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        fVar11 = encode_buffer[uVar8];
        fVar12 = 1.0;
        if (fVar11 <= 1.0) {
          fVar12 = fVar11;
        }
        *(int *)((long)output_buffer + uVar8 * 4) =
             (int)(long)((float)(~-(uint)(fVar11 < 0.0) & (uint)fVar12) * 4.2949673e+09 + 0.5);
      }
      encode_buffer = encode_buffer + lVar10;
      output_buffer = (void *)((long)output_buffer + lVar10 * 4);
    }
    break;
  case 5:
    uVar2 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar2;
    }
    uVar3 = (ulong)(uint)num_pixels;
    if (num_pixels < 1) {
      uVar3 = uVar2;
    }
    for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        lVar4 = (ulong)auStack_b8[uVar8] + uVar2 * lVar10;
        fVar11 = encode_buffer[lVar4];
        fVar12 = 1.0;
        if (fVar11 <= 1.0) {
          fVar12 = fVar11;
        }
        fVar12 = (float)(~-(uint)(fVar11 < 0.0) & (uint)fVar12);
        if (fVar12 <= 0.0031308) {
          fVar12 = fVar12 * 12.92;
        }
        else {
          dVar13 = pow((double)fVar12,0.4166666567325592);
          fVar12 = (float)dVar13 * 1.055 + -0.055;
        }
        *(int *)((long)output_buffer + lVar4 * 4) = (int)(long)(fVar12 * 4.2949673e+09 + 0.5);
      }
      if ((stbir_info->flags & 2) == 0) {
        lVar4 = uVar2 * lVar10 + lVar9;
        fVar11 = encode_buffer[lVar4];
        fVar12 = 1.0;
        if (fVar11 <= 1.0) {
          fVar12 = fVar11;
        }
        *(int *)((long)output_buffer + lVar4 * 4) =
             (int)((float)(~-(uint)(fVar11 < 0.0) & (uint)fVar12) * 4.2949673e+09 + 0.5);
      }
    }
    break;
  case 6:
    uVar3 = 0;
    uVar2 = (ulong)(uint)num_pixels;
    if (num_pixels < 1) {
      uVar2 = uVar3;
    }
    for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        *(float *)((long)output_buffer + uVar8 * 4) = encode_buffer[uVar8];
      }
      encode_buffer = encode_buffer + lVar10;
      output_buffer = (void *)((long)output_buffer + lVar10 * 4);
    }
    break;
  case 7:
    uVar2 = 0;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = uVar2;
    }
    uVar3 = (ulong)(uint)num_pixels;
    if (num_pixels < 1) {
      uVar3 = uVar2;
    }
    for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        lVar4 = (ulong)auStack_b8[uVar8] + uVar2 * lVar10;
        fVar11 = encode_buffer[lVar4];
        if (fVar11 <= 0.0031308) {
          fVar11 = fVar11 * 12.92;
        }
        else {
          dVar13 = pow((double)fVar11,0.4166666567325592);
          fVar11 = (float)dVar13 * 1.055 + -0.055;
        }
        *(float *)((long)output_buffer + lVar4 * 4) = fVar11;
      }
      if ((stbir_info->flags & 2) == 0) {
        lVar4 = uVar2 * lVar10 + lVar9;
        *(float *)((long)output_buffer + lVar4 * 4) = encode_buffer[lVar4];
      }
    }
    break;
  default:
    __assert_fail("!\"Unknown type/colorspace/channels combination.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image_resize.h"
                  ,0x746,
                  "void stbir__encode_scanline(stbir__info *, int, void *, float *, int, int, int)")
    ;
  }
  return;
}

Assistant:

static void stbir__encode_scanline(stbir__info* stbir_info, int num_pixels, void *output_buffer, float *encode_buffer, int channels, int alpha_channel, int decode)
{
    int x;
    int n;
    int num_nonalpha;
    stbir_uint16 nonalpha[STBIR_MAX_CHANNELS];

    if (!(stbir_info->flags&STBIR_FLAG_ALPHA_PREMULTIPLIED))
    {
        for (x=0; x < num_pixels; ++x)
        {
            int pixel_index = x*channels;

            float alpha = encode_buffer[pixel_index + alpha_channel];
            float reciprocal_alpha = alpha ? 1.0f / alpha : 0;

            // unrolling this produced a 1% slowdown upscaling a large RGBA linear-space image on my machine - stb
            for (n = 0; n < channels; n++)
                if (n != alpha_channel)
                    encode_buffer[pixel_index + n] *= reciprocal_alpha;

            // We added in a small epsilon to prevent the color channel from being deleted with zero alpha.
            // Because we only add it for integer types, it will automatically be discarded on integer
            // conversion, so we don't need to subtract it back out (which would be problematic for
            // numeric precision reasons).
        }
    }

    // build a table of all channels that need colorspace correction, so
    // we don't perform colorspace correction on channels that don't need it.
    for (x = 0, num_nonalpha = 0; x < channels; ++x)
    {
        if (x != alpha_channel || (stbir_info->flags & STBIR_FLAG_ALPHA_USES_COLORSPACE))
        {
            nonalpha[num_nonalpha++] = (stbir_uint16)x;
        }
    }

    #define STBIR__ROUND_INT(f)    ((int)          ((f)+0.5))
    #define STBIR__ROUND_UINT(f)   ((stbir_uint32) ((f)+0.5))

    #ifdef STBIR__SATURATE_INT
    #define STBIR__ENCODE_LINEAR8(f)   stbir__saturate8 (STBIR__ROUND_INT((f) * stbir__max_uint8_as_float ))
    #define STBIR__ENCODE_LINEAR16(f)  stbir__saturate16(STBIR__ROUND_INT((f) * stbir__max_uint16_as_float))
    #else
    #define STBIR__ENCODE_LINEAR8(f)   (unsigned char ) STBIR__ROUND_INT(stbir__saturate(f) * stbir__max_uint8_as_float )
    #define STBIR__ENCODE_LINEAR16(f)  (unsigned short) STBIR__ROUND_INT(stbir__saturate(f) * stbir__max_uint16_as_float)
    #endif

    switch (decode)
    {
        case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((unsigned char*)output_buffer)[index] = STBIR__ENCODE_LINEAR8(encode_buffer[index]);
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT8, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((unsigned char*)output_buffer)[index] = stbir__linear_to_srgb_uchar(encode_buffer[index]);
                }

                if (!(stbir_info->flags & STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((unsigned char *)output_buffer)[pixel_index + alpha_channel] = STBIR__ENCODE_LINEAR8(encode_buffer[pixel_index+alpha_channel]);
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((unsigned short*)output_buffer)[index] = STBIR__ENCODE_LINEAR16(encode_buffer[index]);
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT16, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((unsigned short*)output_buffer)[index] = (unsigned short)STBIR__ROUND_INT(stbir__linear_to_srgb(stbir__saturate(encode_buffer[index])) * stbir__max_uint16_as_float);
                }

                if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((unsigned short*)output_buffer)[pixel_index + alpha_channel] = STBIR__ENCODE_LINEAR16(encode_buffer[pixel_index + alpha_channel]);
            }

            break;

        case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((unsigned int*)output_buffer)[index] = (unsigned int)STBIR__ROUND_UINT(((double)stbir__saturate(encode_buffer[index])) * stbir__max_uint32_as_float);
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_UINT32, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((unsigned int*)output_buffer)[index] = (unsigned int)STBIR__ROUND_UINT(((double)stbir__linear_to_srgb(stbir__saturate(encode_buffer[index]))) * stbir__max_uint32_as_float);
                }

                if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((unsigned int*)output_buffer)[pixel_index + alpha_channel] = (unsigned int)STBIR__ROUND_INT(((double)stbir__saturate(encode_buffer[pixel_index + alpha_channel])) * stbir__max_uint32_as_float);
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_LINEAR):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < channels; n++)
                {
                    int index = pixel_index + n;
                    ((float*)output_buffer)[index] = encode_buffer[index];
                }
            }
            break;

        case STBIR__DECODE(STBIR_TYPE_FLOAT, STBIR_COLORSPACE_SRGB):
            for (x=0; x < num_pixels; ++x)
            {
                int pixel_index = x*channels;

                for (n = 0; n < num_nonalpha; n++)
                {
                    int index = pixel_index + nonalpha[n];
                    ((float*)output_buffer)[index] = stbir__linear_to_srgb(encode_buffer[index]);
                }

                if (!(stbir_info->flags&STBIR_FLAG_ALPHA_USES_COLORSPACE))
                    ((float*)output_buffer)[pixel_index + alpha_channel] = encode_buffer[pixel_index + alpha_channel];
            }
            break;

        default:
            STBIR_ASSERT(!"Unknown type/colorspace/channels combination.");
            break;
    }
}